

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resp_msg.hxx
# Opt level: O2

void __thiscall nuraft::resp_msg::~resp_msg(resp_msg *this)

{
  ~resp_msg(this);
  operator_delete(this);
  return;
}

Assistant:

resp_msg(ulong term,
             msg_type type,
             int32 src,
             int32 dst,
             ulong next_idx = 0L,
             bool accepted = false)
        : msg_base(term, type, src, dst)
        , next_idx_(next_idx)
        , next_batch_size_hint_in_bytes_(0)
        , accepted_(accepted)
        , ctx_(nullptr)
        , cb_func_(nullptr)
        , async_cb_func_(nullptr)
        , result_code_(cmd_result_code::OK)
        {}